

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_commands.cpp
# Opt level: O0

Am_Wrapper * check_accel_string_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  char *s_00;
  Am_Wrapper *pAVar3;
  bool local_15a;
  Am_Object local_120;
  Am_Object local_118;
  int local_10c;
  Am_String local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object window;
  char s [38];
  Am_Value local_98;
  Am_Input_Char local_84;
  Am_String local_80;
  Am_String sval;
  undefined1 local_70 [4];
  Am_Input_Char accel_char;
  Am_Value accel_value;
  bool cmd_active;
  Am_Object local_50;
  Am_Object old_cmd_window;
  Am_Object old_cmd_obj;
  Am_Object local_30;
  Am_Object cmd_obj;
  Am_Value cmd_value;
  Am_Object *self_local;
  
  Am_Value::Am_Value((Am_Value *)&cmd_obj);
  Am_Object::Am_Object(&local_30);
  Am_Object::Am_Object(&old_cmd_window);
  Am_Object::Am_Object(&local_50);
  pAVar2 = Am_Object::Peek(self,0x1e3,4);
  Am_Value::operator=((Am_Value *)&cmd_obj,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)&cmd_obj);
  if (bVar1) {
    Am_Object::operator=(&old_cmd_window,(Am_Value *)&cmd_obj);
  }
  pAVar2 = Am_Object::Peek(self,0x1e2,4);
  Am_Value::operator=((Am_Value *)&cmd_obj,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)&cmd_obj);
  if (bVar1) {
    Am_Object::operator=(&local_50,(Am_Value *)&cmd_obj);
  }
  pAVar2 = Am_Object::Peek(self,0xc5,0);
  Am_Value::operator=((Am_Value *)&cmd_obj,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)&cmd_obj);
  if ((bVar1) && ((short)cmd_obj.data == -0x5fff)) {
    Am_Object::operator=(&local_30,(Am_Value *)&cmd_obj);
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffa8,&Am_Command);
    bVar1 = Am_Object::Is_Instance_Of(&local_30,(Am_Object *)&stack0xffffffffffffffa8);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa8);
    if (bVar1) {
      pAVar2 = Am_Object::Peek(self,0xcc,0);
      bVar1 = Am_Value::Valid(pAVar2);
      local_15a = false;
      if (bVar1) {
        pAVar2 = Am_Object::Peek(self,0x17d,0);
        local_15a = Am_Value::Valid(pAVar2);
      }
      Am_Value::Am_Value((Am_Value *)local_70);
      Am_Input_Char::Am_Input_Char
                ((Am_Input_Char *)((long)&sval.data + 4),0,false,false,false,Am_NEITHER,Am_NOT_MOUSE
                 ,false);
      pAVar2 = Am_Object::Peek(&local_30,0x152,0);
      Am_Value::operator=((Am_Value *)local_70,pAVar2);
      bVar1 = Am_Input_Char::Test((Am_Value *)local_70);
      if (bVar1) {
        Am_Input_Char::operator=((Am_Input_Char *)((long)&sval.data + 4),(Am_Value *)local_70);
      }
      else if (local_70._0_2_ == 0x8008) {
        Am_String::Am_String(&local_80);
        Am_String::operator=(&local_80,(Am_Value *)local_70);
        s_00 = Am_String::operator_cast_to_char_(&local_80);
        Am_Input_Char::Am_Input_Char(&local_84,s_00,true);
        Am_Input_Char::operator=((Am_Input_Char *)((long)&sval.data + 4),&local_84);
        Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_98);
        Am_Object::Set(&local_30,0x152,&local_98,0);
        Am_Value::~Am_Value(&local_98);
        Am_String::~Am_String(&local_80);
      }
      bVar1 = Am_Input_Char::Valid((Am_Input_Char *)((long)&sval.data + 4));
      if (bVar1) {
        Am_Input_Char::As_Short_String((Am_Input_Char *)((long)&sval.data + 4),(char *)&window);
        get_window(&local_d0);
        bVar1 = Am_Object::operator!=(&old_cmd_window,&local_30);
        if ((bVar1) || (bVar1 = Am_Object::operator!=(&local_50,&local_d0), bVar1)) {
          bVar1 = Am_Object::Valid(&old_cmd_window);
          if ((bVar1) && (bVar1 = Am_Object::Valid(&local_50), bVar1)) {
            Am_Object::Am_Object(&local_d8,&old_cmd_window);
            Am_Object::Am_Object(&local_e0,&local_50);
            Am_Remove_Accelerator_Command_From_Window(&local_d8,&local_e0);
            Am_Object::~Am_Object(&local_e0);
            Am_Object::~Am_Object(&local_d8);
          }
          bVar1 = Am_Object::Valid(&local_d0);
          if ((bVar1) && (local_15a != false)) {
            Am_Object::Am_Object(&local_e8,&local_30);
            Am_Object::Am_Object(&local_f0,&local_d0);
            Am_Add_Accelerator_Command_To_Window(&local_e8,&local_f0);
            Am_Object::~Am_Object(&local_f0);
            Am_Object::~Am_Object(&local_e8);
            pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_30);
            Am_Object::Set(self,0x1e3,pAVar3,1);
            pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_d0);
            Am_Object::Set(self,0x1e2,pAVar3,1);
          }
          else {
            Am_Object::Set(self,0x1e3,0,1);
            Am_Object::Set(self,0x1e2,0,1);
          }
        }
        else if (((local_15a == false) && (bVar1 = Am_Object::Valid(&old_cmd_window), bVar1)) &&
                (bVar1 = Am_Object::Valid(&local_50), bVar1)) {
          bVar1 = Am_Object::Valid(&local_d0);
          if (bVar1) {
            Am_Object::Am_Object(&local_f8,&old_cmd_window);
            Am_Object::Am_Object(&local_100,&local_50);
            Am_Remove_Accelerator_Command_From_Window(&local_f8,&local_100);
            Am_Object::~Am_Object(&local_100);
            Am_Object::~Am_Object(&local_f8);
          }
          Am_Object::Set(self,0x1e3,0,1);
          Am_Object::Set(self,0x1e2,0,1);
        }
        Am_String::Am_String(&local_108,(char *)&window,true);
        self_local = (Am_Object *)Am_String::operator_cast_to_Am_Wrapper_(&local_108);
        Am_String::~Am_String(&local_108);
        local_10c = 1;
        Am_Object::~Am_Object(&local_d0);
      }
      else {
        local_10c = 0;
      }
      Am_Value::~Am_Value((Am_Value *)local_70);
      if (local_10c != 0) goto LAB_0030762a;
    }
  }
  bVar1 = Am_Object::Valid(&old_cmd_window);
  if ((bVar1) && (bVar1 = Am_Object::Valid(&local_50), bVar1)) {
    Am_Object::Am_Object(&local_118,&old_cmd_window);
    Am_Object::Am_Object(&local_120,&local_50);
    Am_Remove_Accelerator_Command_From_Window(&local_118,&local_120);
    Am_Object::~Am_Object(&local_120);
    Am_Object::~Am_Object(&local_118);
    Am_Object::Set(self,0x1e3,0,1);
    Am_Object::Set(self,0x1e2,0,1);
  }
  self_local = (Am_Object *)0x0;
  local_10c = 1;
LAB_0030762a:
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&old_cmd_window);
  Am_Object::~Am_Object(&local_30);
  Am_Value::~Am_Value((Am_Value *)&cmd_obj);
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_String_Formula(check_accel_string)
{
  Am_Value cmd_value;
  Am_Object cmd_obj, old_cmd_obj, old_cmd_window;
  cmd_value = self.Peek(Am_ACCELERATOR_LIST, Am_NO_DEPENDENCY);
  if (cmd_value.Valid())
    old_cmd_obj = cmd_value;
  cmd_value = self.Peek(Am_ACCELERATOR_INTER, Am_NO_DEPENDENCY);
  if (cmd_value.Valid())
    old_cmd_window = cmd_value;
  cmd_value = self.Peek(Am_COMMAND);
  if (cmd_value.Valid() && cmd_value.type == Am_OBJECT) {
    cmd_obj = cmd_value;
    if (cmd_obj.Is_Instance_Of(Am_Command)) {
      // False,no? --ortalo
      bool cmd_active =
          self.Peek(Am_ACTIVE).Valid() && self.Peek(Am_ACTIVE_2).Valid();
      Am_Value accel_value;
      Am_Input_Char accel_char;
      accel_value = cmd_obj.Peek(Am_ACCELERATOR);
      if (Am_Input_Char::Test(accel_value))
        accel_char = accel_value;
      else if (accel_value.type == Am_STRING) {
        // convert string into right type
        Am_String sval;
        sval = accel_value;
        accel_char = Am_Input_Char((const char *)sval);
        // store it back into the slot so more efficient next time
        // (because no parsing will be needed next time)
        cmd_obj.Set(Am_ACCELERATOR, accel_char);
      }
      //      std::cout << "@@Widget " << self << " command " << cmd_obj
      //		<< " active " << cmd_active
      //		<< " label = " << self.Get(Am_REAL_STRING_OR_OBJ)
      //		<< " accel " << accel_char << std::endl << std::flush;
      // now do comparison
      if (accel_char.Valid()) { //then is a legal accelerator character
        char s[Am_LONGEST_CHAR_STRING];
        accel_char.As_Short_String(s);
        Am_Object window = get_window(self);

        if ((old_cmd_obj != cmd_obj || old_cmd_window != window)) {
          if (old_cmd_obj.Valid() && old_cmd_window.Valid())
            Am_Remove_Accelerator_Command_From_Window(old_cmd_obj,
                                                      old_cmd_window);
          if (window.Valid() && cmd_active) {
            Am_Add_Accelerator_Command_To_Window(cmd_obj, window);
            self.Set(Am_ACCELERATOR_LIST, cmd_obj, Am_OK_IF_NOT_THERE);
            self.Set(Am_ACCELERATOR_INTER, window, Am_OK_IF_NOT_THERE);
          } else {
            self.Set(Am_ACCELERATOR_LIST, (0L), Am_OK_IF_NOT_THERE);
            self.Set(Am_ACCELERATOR_INTER, (0L), Am_OK_IF_NOT_THERE);
          }
        } else if (!cmd_active && old_cmd_obj.Valid() &&
                   old_cmd_window.Valid()) {
          if (window.Valid())
            Am_Remove_Accelerator_Command_From_Window(old_cmd_obj,
                                                      old_cmd_window);
          self.Set(Am_ACCELERATOR_LIST, (0L), Am_OK_IF_NOT_THERE);
          self.Set(Am_ACCELERATOR_INTER, (0L), Am_OK_IF_NOT_THERE);
        }
        //std::cout << "Returning str=" << Am_String(s) <<std::endl <<std::flush;
        return Am_String(s);
      }
    }
  }
  if (old_cmd_obj.Valid() && old_cmd_window.Valid()) {
    Am_Remove_Accelerator_Command_From_Window(old_cmd_obj, old_cmd_window);
    self.Set(Am_ACCELERATOR_LIST, (0L), Am_OK_IF_NOT_THERE);
    self.Set(Am_ACCELERATOR_INTER, (0L), Am_OK_IF_NOT_THERE);
  }

  // no accel string
  return nullptr;
}